

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

Bitmask sqlite3WhereExprListUsage(WhereMaskSet *pMaskSet,ExprList *pList)

{
  Bitmask BVar1;
  int *in_RSI;
  Bitmask mask;
  int i;
  Expr *in_stack_ffffffffffffffd8;
  WhereMaskSet *pMaskSet_00;
  undefined4 local_14;
  
  pMaskSet_00 = (WhereMaskSet *)0x0;
  if (in_RSI != (int *)0x0) {
    for (local_14 = 0; local_14 < *in_RSI; local_14 = local_14 + 1) {
      BVar1 = sqlite3WhereExprUsage(pMaskSet_00,in_stack_ffffffffffffffd8);
      pMaskSet_00 = (WhereMaskSet *)(BVar1 | (ulong)pMaskSet_00);
    }
  }
  return (Bitmask)pMaskSet_00;
}

Assistant:

SQLITE_PRIVATE Bitmask sqlite3WhereExprListUsage(WhereMaskSet *pMaskSet, ExprList *pList){
  int i;
  Bitmask mask = 0;
  if( pList ){
    for(i=0; i<pList->nExpr; i++){
      mask |= sqlite3WhereExprUsage(pMaskSet, pList->a[i].pExpr);
    }
  }
  return mask;
}